

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int32_t zng_deflateTune(zng_stream *strm,int32_t good_length,int32_t max_lazy,int32_t nice_length,
                       int32_t max_chain)

{
  internal_state *piVar1;
  int iVar2;
  int32_t iVar3;
  
  iVar2 = deflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    piVar1->good_match = good_length;
    piVar1->max_lazy_match = max_lazy;
    piVar1->nice_match = nice_length;
    piVar1->max_chain_length = max_chain;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateTune)(PREFIX3(stream) *strm, int32_t good_length, int32_t max_lazy, int32_t nice_length, int32_t max_chain) {
    deflate_state *s;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;
    s->good_match = (unsigned int)good_length;
    s->max_lazy_match = (unsigned int)max_lazy;
    s->nice_match = nice_length;
    s->max_chain_length = (unsigned int)max_chain;
    return Z_OK;
}